

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

void embree::gather_grid(RTCGeometry geom,avector<Vec3fa> *positions,size_t width,size_t height,
                        uint *indices,avector<Vec3fa> *vertices,uint edgey)

{
  Vec3fa *pVVar1;
  float *pfVar2;
  Vec3fa *pVVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  uint uVar8;
  undefined4 uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  
  uVar10 = (ulong)edgey;
  lVar14 = 0;
  uVar11 = 0;
  while (uVar11 != height) {
    uVar12 = 1;
    uVar9 = (undefined4)uVar10;
    lVar13 = lVar14;
    while( true ) {
      pVVar1 = vertices->items + indices[uVar10 & 0xffffffff];
      fVar4 = (pVVar1->field_0).m128[1];
      fVar5 = (pVVar1->field_0).m128[2];
      fVar6 = (pVVar1->field_0).m128[3];
      if (-width + uVar12 == 1) break;
      pfVar2 = (float *)((long)&positions->items->field_0 + lVar13);
      *pfVar2 = (pVVar1->field_0).m128[0];
      pfVar2[1] = fVar4;
      pfVar2[2] = fVar5;
      pfVar2[3] = fVar6;
      uVar10 = rtcGetGeometryPreviousHalfEdge(geom,uVar10 & 0xffffffff);
      if (uVar12 < width) {
        uVar7 = rtcGetGeometryPreviousHalfEdge(geom,uVar10 & 0xffffffff);
        uVar10 = rtcGetGeometryOppositeHalfEdge(geom,0,uVar7);
      }
      uVar12 = uVar12 + 1;
      lVar13 = lVar13 + 0x10;
    }
    pVVar3 = positions->items + uVar11 * (width + 1) + width;
    (pVVar3->field_0).m128[0] = (pVVar1->field_0).m128[0];
    (pVVar3->field_0).m128[1] = fVar4;
    (pVVar3->field_0).m128[2] = fVar5;
    (pVVar3->field_0).m128[3] = fVar6;
    uVar8 = rtcGetGeometryNextHalfEdge(geom,uVar9);
    uVar10 = (ulong)uVar8;
    uVar11 = uVar11 + 1;
    if (uVar11 < height) {
      uVar9 = rtcGetGeometryOppositeHalfEdge(geom,0,uVar10);
      uVar8 = rtcGetGeometryNextHalfEdge(geom,uVar9);
      uVar10 = (ulong)uVar8;
    }
    lVar14 = lVar14 + width * 0x10 + 0x10;
  }
  lVar14 = (width + 1) * height;
  lVar13 = lVar14 * 0x10;
  uVar11 = 1;
  while( true ) {
    pVVar1 = vertices->items + indices[uVar10];
    fVar4 = (pVVar1->field_0).m128[1];
    fVar5 = (pVVar1->field_0).m128[2];
    fVar6 = (pVVar1->field_0).m128[3];
    if (-width + uVar11 == 1) break;
    pfVar2 = (float *)((long)&positions->items->field_0 + lVar13);
    *pfVar2 = (pVVar1->field_0).m128[0];
    pfVar2[1] = fVar4;
    pfVar2[2] = fVar5;
    pfVar2[3] = fVar6;
    uVar8 = rtcGetGeometryNextHalfEdge(geom);
    uVar10 = (ulong)uVar8;
    if (uVar11 < width) {
      uVar9 = rtcGetGeometryOppositeHalfEdge(geom,0,uVar10);
      uVar8 = rtcGetGeometryNextHalfEdge(geom,uVar9);
      uVar10 = (ulong)uVar8;
    }
    uVar11 = uVar11 + 1;
    lVar13 = lVar13 + 0x10;
  }
  pVVar3 = positions->items + lVar14 + width;
  (pVVar3->field_0).m128[0] = (pVVar1->field_0).m128[0];
  (pVVar3->field_0).m128[1] = fVar4;
  (pVVar3->field_0).m128[2] = fVar5;
  (pVVar3->field_0).m128[3] = fVar6;
  return;
}

Assistant:

void gather_grid(RTCGeometry geom, avector<Vec3fa>& positions, size_t width, size_t height, unsigned int* indices, avector<Vec3fa>& vertices, unsigned int edgey)
  {
    //        
    // | <----------    <----------
    // |            /\ |           /\ .
    // | edgey       | |           |
    // |             | |           |
    // \/            | \/          |
    
    /* gather all rows */
    size_t y=0;
    for (; y<height; y++)
    {
      /* here edgey points from top/left vertex downwards */
      unsigned int edgex = edgey;

      /* gather all columns */
      size_t x=0;
      for (; x<width; x++)
      {
        /* here edgex points from left vertex of row downwards */
        positions[y*(width+1)+x] = vertices[indices[edgex]];

        /* prev -> prev -> opposite moves to the next column (unless we reach the right end) */
        edgex = rtcGetGeometryPreviousHalfEdge(geom,edgex);
        if (x+1 < width) {
          edgex = rtcGetGeometryPreviousHalfEdge(geom,edgex);
          edgex = rtcGetGeometryOppositeHalfEdge(geom,0,edgex);
        }
      }
      /* load rightmost vertex */
      positions[y*(width+1)+x] = vertices[indices[edgex]];

      /* next -> opposite -> next moves to next row (unless we reach the bottom) */
      edgey = rtcGetGeometryNextHalfEdge(geom,edgey);
      if (y+1 < height) {
        edgey = rtcGetGeometryOppositeHalfEdge(geom,0,edgey);
        edgey = rtcGetGeometryNextHalfEdge(geom,edgey);
      }
    }

    /* special treatment for last row, edgy points from the bottom/left vertex to the right */
    unsigned int edgex = edgey;
    for (size_t x=0; x<width; x++)
    {
      positions[y*(width+1)+x] = vertices[indices[edgex]];

      /* next -> opposite -> next moves to the next column (unless we reach the right end) */
      edgex = rtcGetGeometryNextHalfEdge(geom,edgex);
      if (x+1 < width) {
        edgex = rtcGetGeometryOppositeHalfEdge(geom,0,edgex);
        edgex = rtcGetGeometryNextHalfEdge(geom,edgex);
      }
    }
    /* load rightmost vertex */
    positions[height*(width+1)+width] = vertices[indices[edgex]];
  }